

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int tinsert(lua_State *L)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint n;
  
  luaL_checktype(L,1,5);
  sVar2 = lua_objlen(L,1);
  uVar4 = (int)sVar2 + 1;
  iVar1 = (int)((ulong)((long)L->top - (long)L->base) >> 4);
  n = uVar4;
  if (iVar1 != 2) {
    if (iVar1 != 3) {
      luaL_error(L,"wrong number of arguments to \'insert\'");
    }
    uVar3 = luaL_checkinteger(L,2);
    n = (uint)uVar3;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 <= (int)n) {
      uVar5 = uVar3 & 0xffffffff;
    }
    while (iVar1 = (int)uVar5, (int)n < iVar1) {
      lua_rawgeti(L,1,iVar1 - 1U);
      lua_rawseti(L,1,iVar1);
      uVar5 = (ulong)(iVar1 - 1U);
    }
  }
  lua_rawseti(L,1,n);
  return 0;
}

Assistant:

static int tinsert(lua_State*L){
int e=aux_getn(L,1)+1;
int pos;
switch(lua_gettop(L)){
case 2:{
pos=e;
break;
}
case 3:{
int i;
pos=luaL_checkint(L,2);
if(pos>e)e=pos;
for(i=e;i>pos;i--){
lua_rawgeti(L,1,i-1);
lua_rawseti(L,1,i);
}
break;
}
default:{
return luaL_error(L,"wrong number of arguments to "LUA_QL("insert"));
}
}
luaL_setn(L,1,e);
lua_rawseti(L,1,pos);
return 0;
}